

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O0

void Imath_3_2::(anonymous_namespace)::jacobiRotateRight<1,2,Imath_3_2::Matrix44<float>>
               (Matrix44<float> *A,BaseType s,BaseType tau)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  float *pfVar4;
  Matrix44<float> *in_RDI;
  float in_XMM0_Da;
  float in_XMM1_Da;
  T nu2;
  T nu1;
  uint i;
  uint local_14;
  
  local_14 = 0;
  while( true ) {
    uVar3 = Matrix44<float>::dimensions();
    if (uVar3 <= local_14) break;
    pfVar4 = Matrix44<float>::operator[](in_RDI,local_14);
    fVar1 = pfVar4[1];
    pfVar4 = Matrix44<float>::operator[](in_RDI,local_14);
    fVar2 = pfVar4[2];
    pfVar4 = Matrix44<float>::operator[](in_RDI,local_14);
    pfVar4[1] = -in_XMM0_Da * (in_XMM1_Da * fVar1 + fVar2) + pfVar4[1];
    pfVar4 = Matrix44<float>::operator[](in_RDI,local_14);
    pfVar4[2] = in_XMM0_Da * (-in_XMM1_Da * fVar2 + fVar1) + pfVar4[2];
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

inline void
jacobiRotateRight (
    TM& A, const typename TM::BaseType s, const typename TM::BaseType tau)
{
    typedef typename TM::BaseType T;

    for (unsigned int i = 0; i < TM::dimensions (); ++i)
    {
        const T nu1 = A[i][j];
        const T nu2 = A[i][k];
        A[i][j] -= s * (nu2 + tau * nu1);
        A[i][k] += s * (nu1 - tau * nu2);
    }
}